

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImGuiWindow ** __thiscall
ImVector<ImGuiWindow_*>::insert(ImVector<ImGuiWindow_*> *this,ImGuiWindow **it,ImGuiWindow **v)

{
  int iVar1;
  int new_capacity;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ImGuiWindow **ppIVar6;
  
  ppIVar6 = this->Data;
  if (ppIVar6 <= it) {
    iVar1 = this->Size;
    lVar3 = (long)iVar1;
    if (it <= ppIVar6 + lVar3) {
      lVar5 = (long)it - (long)ppIVar6;
      if (iVar1 == this->Capacity) {
        if (iVar1 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar1 / 2 + iVar1;
        }
        new_capacity = iVar1 + 1;
        if (iVar1 + 1 < iVar2) {
          new_capacity = iVar2;
        }
        reserve(this,new_capacity);
        lVar3 = (long)this->Size;
        ppIVar6 = this->Data;
      }
      lVar4 = lVar3 - (lVar5 >> 3);
      if (lVar4 != 0 && lVar5 >> 3 <= lVar3) {
        memmove((void *)((long)ppIVar6 + lVar5 + 8),(void *)((long)ppIVar6 + lVar5),lVar4 * 8);
        ppIVar6 = this->Data;
      }
      *(ImGuiWindow **)((long)ppIVar6 + lVar5) = *v;
      this->Size = this->Size + 1;
      return (ImGuiWindow **)(lVar5 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x500,
                "T *ImVector<ImGuiWindow *>::insert(const T *, const T &) [T = ImGuiWindow *]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }